

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void funcargs(LexState *ls,expdesc *f,int line)

{
  int iVar1;
  int i;
  int local_48;
  int nparams;
  int base;
  expdesc args;
  FuncState *fs;
  int line_local;
  expdesc *f_local;
  LexState *ls_local;
  
  args._16_8_ = ls->fs;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x28) {
    luaX_next(ls);
    if ((ls->t).token == 0x29) {
      nparams = 0;
    }
    else {
      explist(ls,(expdesc *)&nparams);
      luaK_setreturns((FuncState *)args._16_8_,(expdesc *)&nparams,-1);
    }
    check_match(ls,0x29,0x28,line);
  }
  else if (iVar1 == 0x7b) {
    constructor(ls,(expdesc *)&nparams);
  }
  else {
    if (iVar1 != 0x125) {
      luaX_syntaxerror(ls,"function arguments expected");
    }
    codestring(ls,(expdesc *)&nparams,(ls->t).seminfo.ts);
    luaX_next(ls);
  }
  iVar1 = (f->u).info;
  if ((nparams == 0xd) || (nparams == 0xe)) {
    local_48 = -1;
  }
  else {
    if (nparams != 0) {
      luaK_exp2nextreg((FuncState *)args._16_8_,(expdesc *)&nparams);
    }
    local_48 = (uint)*(byte *)(args._16_8_ + 0x3c) - (iVar1 + 1);
  }
  i = luaK_codeABC((FuncState *)args._16_8_,OP_CALL,iVar1,local_48 + 1,2);
  init_exp(f,VCALL,i);
  luaK_fixline((FuncState *)args._16_8_,line);
  *(char *)(args._16_8_ + 0x3c) = (char)iVar1 + '\x01';
  return;
}

Assistant:

static void funcargs(LexState *ls, expdesc *f, int line) {
    FuncState *fs = ls->fs;
    expdesc args;
    int base, nparams;
    switch (ls->t.token) {
        case '(': {  /* funcargs -> '(' [ explist ] ')' */
            luaX_next(ls);
            if (ls->t.token == ')')  /* arg list is empty? */
                args.k = VVOID;
            else {
                explist(ls, &args);
                luaK_setmultret(fs, &args);
            }
            check_match(ls, ')', '(', line);
            break;
        }
        case '{': {  /* funcargs -> constructor */
            constructor(ls, &args);
            break;
        }
        case TK_STRING: {  /* funcargs -> STRING */
            codestring(ls, &args, ls->t.seminfo.ts);
            luaX_next(ls);  /* must use 'seminfo' before 'next' */
            break;
        }
        default: {
            luaX_syntaxerror(ls, "function arguments expected");
        }
    }
    lua_assert(f->k == VNONRELOC);
    base = f->u.info;  /* base register for call */
    if (hasmultret(args.k))
        nparams = LUA_MULTRET;  /* open call */
    else {
        if (args.k != VVOID)
            luaK_exp2nextreg(fs, &args);  /* close last argument */
        nparams = fs->freereg - (base + 1);
    }
    init_exp(f, VCALL, luaK_codeABC(fs, OP_CALL, base, nparams + 1, 2));
    luaK_fixline(fs, line);
    fs->freereg = base + 1;  /* call remove function and arguments and leaves
                            (unless changed) one result */
}